

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul-lace.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint32_t *puVar1;
  Task *__dq_head;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int extraout_EAX;
  size_t dqsize;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  Task *extraout_RAX;
  Task *pTVar6;
  Task *extraout_RAX_00;
  Task *extraout_RAX_01;
  uint uVar7;
  Worker *pWVar8;
  void *pvVar9;
  Task *__dq_head_00;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  timespec tv;
  undefined1 local_b0 [24];
  void *local_98;
  void *local_90;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  char local_78 [72];
  
  __dq_head_00 = (Task *)argv;
  iVar2 = getopt(argc,argv,"w:q:h");
  iVar2 = iVar2 << 0x18;
  if (iVar2 == -0x1000000) {
    uVar3 = 1;
    dqsize = 100000;
  }
  else {
    iVar4 = 100000;
    uVar3 = 1;
    do {
      iVar2 = iVar2 >> 0x18;
      if (iVar2 == 0x71) {
        iVar4 = atoi(_optarg);
      }
      else if (iVar2 == 0x77) {
        uVar3 = atoi(_optarg);
      }
      else {
        if (iVar2 != 0x68) {
          abort();
        }
        main_cold_1();
      }
      __dq_head_00 = (Task *)argv;
      iVar2 = getopt(argc,argv,"w:q:h");
      iVar2 = iVar2 << 0x18;
    } while (iVar2 != -0x1000000);
    dqsize = (size_t)iVar4;
  }
  if (_optind != argc) {
    uVar5 = atoi(argv[_optind]);
    sVar10 = (ulong)(uVar5 * uVar5) << 2;
    __ptr = malloc(sVar10);
    __ptr_00 = malloc(sVar10);
    __ptr_01 = malloc(sVar10);
    if (0 < (int)uVar5) {
      uVar13 = (ulong)uVar5;
      uVar12 = 0;
      pvVar9 = __ptr;
      do {
        uVar11 = 0;
        do {
          iVar2 = rand();
          *(float *)((long)pvVar9 + uVar11 * 4) = (float)iVar2;
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
        uVar12 = uVar12 + 1;
        pvVar9 = (void *)((long)pvVar9 + uVar13 * 4);
      } while (uVar12 != uVar13);
      if (0 < (int)uVar5) {
        uVar12 = 0;
        pvVar9 = __ptr_00;
        do {
          uVar11 = 0;
          do {
            iVar2 = rand();
            *(float *)((long)pvVar9 + uVar11 * 4) = (float)iVar2;
            uVar11 = uVar11 + 1;
          } while (uVar13 != uVar11);
          uVar12 = uVar12 + 1;
          pvVar9 = (void *)((long)pvVar9 + uVar13 * 4);
        } while (uVar12 != uVar13);
        if (0 < (int)uVar5) {
          sVar10 = uVar13 * 4;
          uVar12 = 0;
          do {
            memset((void *)((long)__ptr_01 + uVar12 * 4),0,sVar10);
            uVar12 = (ulong)((int)uVar12 + uVar5);
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
      }
    }
    lace_start(uVar3,dqsize);
    clock_gettime(1,(timespec *)local_b0);
    dVar14 = (double)(long)local_b0._0_8_;
    dVar15 = (double)(long)local_b0._8_8_;
    local_b0._0_8_ = rec_matmul_WRAP;
    local_b0._8_8_ = (_Worker *)0x1;
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_b0._16_8_ = __ptr;
    local_98 = __ptr_00;
    local_90 = __ptr_01;
    local_88 = uVar5;
    local_84 = uVar5;
    local_80 = uVar5;
    local_7c = uVar5;
    lace_run_task((Task *)local_b0);
    clock_gettime(1,(timespec *)local_b0);
    printf("Time: %f\n",
           ((double)(long)local_b0._8_8_ * 1e-09 + (double)(long)local_b0._0_8_) -
           (dVar15 * 1e-09 + dVar14));
    lace_stop();
    free(__ptr_01);
    free(__ptr_00);
    free(__ptr);
    return 0;
  }
  main_cold_2();
  pTVar6 = extraout_RAX;
  if (((WorkerP *)argv)->allstolen == '\0') {
    if (((WorkerP *)argv)->split <= __dq_head_00) {
LAB_00101ea2:
      pWVar8 = ((WorkerP *)argv)->_public;
      if (pWVar8->movesplit != '\0') {
        uVar12 = ((long)__dq_head_00 - (long)((WorkerP *)argv)->split >> 7) + 1U >> 1;
        ((WorkerP *)argv)->split = ((WorkerP *)argv)->split + uVar12;
        LOCK();
        puVar1 = &(pWVar8->ts).ts.split;
        *puVar1 = *puVar1 + (int)uVar12;
        UNLOCK();
        pWVar8->movesplit = '\0';
      }
      __dq_head_00->thief = (_Worker *)0x0;
      rec_matmul_CALL((WorkerP *)argv,__dq_head_00,*(float **)__dq_head_00->d,
                      *(float **)(__dq_head_00->d + 8),*(float **)(__dq_head_00->d + 0x10),
                      *(int *)(__dq_head_00->d + 0x18),*(int *)(__dq_head_00->d + 0x1c),
                      *(int *)(__dq_head_00->d + 0x20),*(int *)(__dq_head_00->d + 0x24),
                      *(int *)(__dq_head_00->d + 0x28));
      return extraout_EAX;
    }
    pTVar6 = (Task *)((WorkerP *)argv)->_public;
    uVar5 = (uint)pTVar6->thief;
    uVar3 = (uint)((ulong)pTVar6->thief >> 0x20);
    if (uVar5 != uVar3) {
      uVar7 = uVar5 + uVar3 >> 1;
      *(uint *)((long)&pTVar6->thief + 4) = uVar7;
      uVar5 = *(uint *)&pTVar6->thief;
      if (uVar5 != uVar3) {
        if (uVar7 < uVar5) {
          uVar7 = uVar5 + uVar3 >> 1;
          *(uint *)((long)&pTVar6->thief + 4) = uVar7;
        }
        ((WorkerP *)argv)->split = ((WorkerP *)argv)->dq + uVar7;
        goto LAB_00101ea2;
      }
    }
    pTVar6->d[0] = '\x01';
    ((WorkerP *)argv)->allstolen = '\x01';
  }
  pWVar8 = __dq_head_00->thief;
  if (pWVar8 != (Worker *)0x2) {
    while (pWVar8 < (Worker *)0x2) {
      pWVar8 = __dq_head_00->thief;
    }
    if (pWVar8 != (Worker *)0x2) {
      __dq_head = __dq_head_00 + 1;
      iVar2 = 0x20;
      do {
        pTVar6 = (Task *)lace_steal((WorkerP *)argv,__dq_head,pWVar8);
        if (pTVar6 == (Task *)0x2) {
          pTVar6 = lace_newframe.t;
          if (lace_newframe.t != (Task *)0x0) {
            lace_yield((WorkerP *)argv,__dq_head);
            pTVar6 = extraout_RAX_01;
          }
          iVar2 = iVar2 + -1;
          if (iVar2 == 0) {
            lace_steal_random_CALL((WorkerP *)argv,__dq_head);
            iVar2 = 0x20;
            pTVar6 = extraout_RAX_00;
          }
        }
        pWVar8 = __dq_head_00->thief;
      } while (pWVar8 != (Worker *)0x2);
    }
    if (((WorkerP *)argv)->allstolen == '\0') {
      pTVar6 = (Task *)((WorkerP *)argv)->_public;
      pTVar6->d[0] = '\x01';
      ((WorkerP *)argv)->allstolen = '\x01';
    }
  }
  __dq_head_00->thief = (_Worker *)0x0;
  return (int)pTVar6;
}

Assistant:

int main(int argc, char *argv[])
{
    int workers = 1;
    int dqsize = 100000;

    char c;
    while ((c=getopt(argc, argv, "w:q:h")) != -1) {
        switch (c) {
            case 'w':
                workers = atoi(optarg);
                break;
            case 'q':
                dqsize = atoi(optarg);
                break;
            case 'h':
                usage(argv[0]);
                break;
            default:
                abort();
        }
    }

    if (optind == argc) {
        usage(argv[0]);
        exit(1);
    }

    int n = atoi(argv[optind]);

    REAL *A  = malloc(n * n * sizeof(REAL));
    REAL *B  = malloc(n * n * sizeof(REAL));
    REAL *C1 = malloc(n * n * sizeof(REAL));
    REAL *C2 = malloc(n * n * sizeof(REAL));

    init(A, n);
    init(B, n);
    zero(C1, n);
    zero(C2, n);

    lace_start(workers, dqsize);

    double t1 = wctime();
    RUN(rec_matmul, A, B, C2, n, n, n, n, 0); 
    double t2 = wctime();

    printf("Time: %f\n", t2-t1);
/*
    iter_matmul(A, B, C1, n);
    double err = maxerror(C1, C2, n);

    printf("Max error matmul(%d x %d) = %g\n", n, n, err);
*/
    lace_stop();

    free(C2);
    free(C1);
    free(B);
    free(A);
    return 0;
}